

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asteroid.cpp
# Opt level: O1

bool __thiscall Asteroid::logic(Asteroid *this,int step)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  Entity *pEVar4;
  float fVar5;
  
  fVar5 = (float)step;
  this->angle = this->angle - *(float *)&(this->super_Entity).field_0x34 * fVar5;
  pEVar4 = Entity::getPlayerCollision(&this->super_Entity);
  if (pEVar4 != (Entity *)0x0) {
    Entity::explode(&this->super_Entity);
    (*pEVar4->_vptr_Entity[4])(pEVar4,1);
    my_play_sample(0x1c);
    return false;
  }
  uVar1 = this->speed_x;
  uVar2 = this->speed_y;
  (this->super_Entity).dx = fVar5 * (float)uVar1;
  (this->super_Entity).dy = fVar5 * (float)uVar2;
  Entity::wrap(&this->super_Entity);
  bVar3 = Entity::logic(&this->super_Entity,step);
  return bVar3;
}

Assistant:

bool Asteroid::logic(int step)
{
   angle -= da * step;

   Player *p = (Player *)getPlayerCollision();
   if (p) {
      explode();
      p->hit(1);
      my_play_sample(RES_COLLISION);
      return false;
   }

   dx = speed_x * step;
   dy = speed_y * step;

   Entity::wrap();

   if (!Entity::logic(step))
      return false;

   return true;
}